

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b::BuildLogRecompactTestRecompact::Run(BuildLogRecompactTestRecompact *this)

{
  Test *pTVar1;
  bool bVar2;
  reference ppEVar3;
  Entries *pEVar4;
  size_type sVar5;
  LogEntry *pLVar6;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  BuildLog log3;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  BuildLog log2;
  int i;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string err;
  BuildLog log1;
  BuildLogRecompactTestRecompact *this_local;
  
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)&log1.needs_recompaction_);
  AssertParse(&(this->super_BuildLogRecompactTest).super_BuildLogTest.
               super_StateTestWithBuiltinRules.state_,"build out: cat in\nbuild out2: cat in\n",
              (ManifestParserOptions)log1._64_8_);
  BuildLog::BuildLog((BuildLog *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_80);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"BuildLogTest-tempfile",&local_a1);
  bVar2 = BuildLog::OpenForWrite
                    ((BuildLog *)((long)&err.field_2 + 8),&local_a0,
                     &(this->super_BuildLogRecompactTest).super_BuildLogTest.super_BuildLogUser,
                     (string *)local_80);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
             ,0x116,"log1.OpenForWrite(kTestFilename, *this, &err)");
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x117,"\"\" == err");
  if (bVar2) {
    for (log2._68_4_ = 0; (int)log2._68_4_ < 200; log2._68_4_ = log2._68_4_ + 1) {
      ppEVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          (&(this->super_BuildLogRecompactTest).super_BuildLogTest.
                            super_StateTestWithBuiltinRules.state_.edges_,0);
      BuildLog::RecordCommand
                ((BuildLog *)((long)&err.field_2 + 8),*ppEVar3,0xf,log2._68_4_ + 0x12,0);
    }
    ppEVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                        (&(this->super_BuildLogRecompactTest).super_BuildLogTest.
                          super_StateTestWithBuiltinRules.state_.edges_,1);
    BuildLog::RecordCommand((BuildLog *)((long)&err.field_2 + 8),*ppEVar3,0x15,0x16,0);
    BuildLog::Close((BuildLog *)((long)&err.field_2 + 8));
    BuildLog::BuildLog((BuildLog *)local_108);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"BuildLogTest-tempfile",&local_129);
    bVar2 = BuildLog::Load((BuildLog *)local_108,&local_128,(string *)local_80);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
               ,0x121,"log2.Load(kTestFilename, &err)");
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_80);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                       ,0x122,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar2) {
      pEVar4 = BuildLog::entries((BuildLog *)local_108);
      sVar5 = std::
              unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
              ::size(pEVar4);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar5 == 2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                         ,0x123,"2u == log2.entries().size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"out",&local_151);
        pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_108,&local_150);
        bVar2 = testing::Test::Check
                          (pTVar1,pLVar6 != (LogEntry *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                           ,0x124,"log2.LookupByOutput(\"out\")");
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        pTVar1 = g_current_test;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"out2",&local_179)
          ;
          pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_108,&local_178);
          bVar2 = testing::Test::Check
                            (pTVar1,pLVar6 != (LogEntry *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                             ,0x125,"log2.LookupByOutput(\"out2\")");
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator(&local_179);
          pTVar1 = g_current_test;
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"BuildLogTest-tempfile",
                       (allocator<char> *)&log3.field_0x47);
            bVar2 = BuildLog::OpenForWrite
                              ((BuildLog *)local_108,&local_1a0,
                               &(this->super_BuildLogRecompactTest).super_BuildLogTest.
                                super_BuildLogUser,(string *)local_80);
            testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                       ,0x127,"log2.OpenForWrite(kTestFilename, *this, &err)");
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator((allocator<char> *)&log3.field_0x47);
            BuildLog::Close((BuildLog *)local_108);
            BuildLog::BuildLog((BuildLog *)local_1f0);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_210,"BuildLogTest-tempfile",&local_211);
            bVar2 = BuildLog::Load((BuildLog *)local_108,&local_210,(string *)local_80);
            testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                       ,300,"log2.Load(kTestFilename, &err)");
            std::__cxx11::string::~string((string *)&local_210);
            std::allocator<char>::~allocator(&local_211);
            pTVar1 = g_current_test;
            bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_80);
            bVar2 = testing::Test::Check
                              (pTVar1,bVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                               ,0x12d,"\"\" == err");
            pTVar1 = g_current_test;
            if (bVar2) {
              pEVar4 = BuildLog::entries((BuildLog *)local_108);
              sVar5 = std::
                      unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                      ::size(pEVar4);
              bVar2 = testing::Test::Check
                                (pTVar1,sVar5 == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                                 ,0x12e,"1u == log2.entries().size()");
              pTVar1 = g_current_test;
              if (bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_238,"out",&local_239);
                pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_108,&local_238);
                bVar2 = testing::Test::Check
                                  (pTVar1,pLVar6 != (LogEntry *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                                   ,0x12f,"log2.LookupByOutput(\"out\")");
                std::__cxx11::string::~string((string *)&local_238);
                std::allocator<char>::~allocator(&local_239);
                pTVar1 = g_current_test;
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_260,"out2",&local_261);
                  pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_108,&local_260);
                  bVar2 = testing::Test::Check
                                    (pTVar1,pLVar6 == (LogEntry *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                                     ,0x130,"log2.LookupByOutput(\"out2\")");
                  std::__cxx11::string::~string((string *)&local_260);
                  std::allocator<char>::~allocator(&local_261);
                  if (((bVar2 ^ 0xffU) & 1) != 0) {
                    testing::Test::AddAssertionFailure(g_current_test);
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
            }
            BuildLog::~BuildLog((BuildLog *)local_1f0);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    BuildLog::~BuildLog((BuildLog *)local_108);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_80);
  BuildLog::~BuildLog((BuildLog *)((long)&err.field_2 + 8));
  return;
}

Assistant:

TEST_F(BuildLogRecompactTest, Recompact) {
  AssertParse(&state_,
"build out: cat in\n"
"build out2: cat in\n");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  // Record the same edge several times, to trigger recompaction
  // the next time the log is opened.
  for (int i = 0; i < 200; ++i)
    log1.RecordCommand(state_.edges_[0], 15, 18 + i);
  log1.RecordCommand(state_.edges_[1], 21, 22);
  log1.Close();

  // Load...
  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));
  // ...and force a recompaction.
  EXPECT_TRUE(log2.OpenForWrite(kTestFilename, *this, &err));
  log2.Close();

  // "out2" is dead, it should've been removed.
  BuildLog log3;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out"));
  ASSERT_FALSE(log2.LookupByOutput("out2"));
}